

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test3::programInfo::programInfo(programInfo *this)

{
  programInfo *this_local;
  
  this->m_fragment_shader_id = 0;
  this->m_geometry_shader_id = 0;
  this->m_program_object_id = 0;
  this->m_tesselation_control_shader_id = 0;
  this->m_tesselation_evaluation_shader_id = 0;
  this->m_vertex_shader_id = 0;
  this->m_buffer_size = 0;
  this->m_uniform_block_index = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_uniform_offsets);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_uniform_matrix_strides);
  return;
}

Assistant:

GPUShaderFP64Test3::programInfo::programInfo()
	: m_fragment_shader_id(0)
	, m_geometry_shader_id(0)
	, m_program_object_id(0)
	, m_tesselation_control_shader_id(0)
	, m_tesselation_evaluation_shader_id(0)
	, m_vertex_shader_id(0)
	, m_buffer_size(0)
	, m_uniform_block_index(0)
{
	/* Nothing to be done here */
}